

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void get_lot_bounds(chunk *c,loc_conflict xroads,loc_conflict lot,wchar_t lot_wid,wchar_t lot_hgt,
                   int *west,int *north,int *east,int *south)

{
  wchar_t wVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000084;
  int iVar6;
  
  iVar5 = xroads.x;
  iVar3 = lot.x;
  if ((ulong)lot >> 0x20 == 0 || iVar3 == 0) {
    *west = 0;
    *(int *)CONCAT44(in_register_0000000c,lot_wid) = 0;
    *(undefined4 *)CONCAT44(in_register_00000084,lot_hgt) = 0;
    iVar5 = 0;
  }
  else {
    iVar4 = iVar3 * 6;
    if (iVar3 < 0) {
      iVar6 = iVar5 + iVar4 + -1;
      iVar3 = 4;
    }
    else {
      iVar6 = iVar5 + iVar4 + -4;
      iVar3 = 1;
    }
    if (iVar6 < 3) {
      iVar6 = 2;
    }
    *(int *)CONCAT44(in_register_0000000c,lot_wid) = iVar6;
    iVar6 = c->width + L'\xfffffffd';
    iVar4 = iVar3 + iVar5 + iVar4;
    if (iVar6 < iVar4) {
      iVar4 = iVar6;
    }
    *west = iVar4;
    uVar2 = (uint)((ulong)lot >> 0x1e) & 0xfffffffc;
    iVar3 = xroads.y;
    if ((long)lot < 0) {
      iVar5 = 2;
      if (2 < (int)(uVar2 + iVar3)) {
        iVar5 = uVar2 + iVar3;
      }
      *(int *)CONCAT44(in_register_00000084,lot_hgt) = iVar5;
      wVar1 = c->height;
      iVar3 = uVar2 + iVar3 + 3;
    }
    else {
      iVar4 = iVar3 + uVar2 + -2;
      iVar5 = 2;
      if (2 < iVar4) {
        iVar5 = iVar4;
      }
      *(int *)CONCAT44(in_register_00000084,lot_hgt) = iVar5;
      wVar1 = c->height;
      iVar3 = uVar2 + iVar3 + 1;
    }
    iVar5 = wVar1 + L'\xfffffffd';
    if (iVar3 <= wVar1 + L'\xfffffffd') {
      iVar5 = iVar3;
    }
  }
  *north = iVar5;
  return;
}

Assistant:

static void get_lot_bounds(struct chunk *c, struct loc xroads, struct loc lot,
		int lot_wid, int lot_hgt,
		int *west, int *north, int *east, int *south) {

	// 0 is the road. no lots.
	if (lot.x == 0 || lot.y == 0) {
		*east = 0;
		*west = 0;
		*north = 0;
		*south = 0;
		return;
	}

	if (lot.x < 0) {
		*west = MAX(2, xroads.x - 1 + (lot.x) * lot_wid);
		*east = MIN(c->width - 3, xroads.x - 2 + (lot.x + 1) * lot_wid);
	} else {
		*west = MAX(2, xroads.x + 2 + (lot.x - 1) * lot_wid);
		*east = MIN(c->width - 3, xroads.x + 1 + (lot.x) * lot_wid);
	}

	if (lot.y < 0) {
		*north = MAX(2, xroads.y + (lot.y) * lot_hgt);
		*south = MIN(c->height - 3, xroads.y - 1 + (lot.y + 1) * lot_hgt);
	} else {
		*north = MAX(2, xroads.y + 2 + (lot.y - 1) * lot_hgt);
		*south = MIN(c->height - 3, xroads.y + 1 + (lot.y) * lot_hgt);
	}
}